

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O0

void uv__signal_stop(uv_signal_t *handle)

{
  uv_signal_s *puVar1;
  uv_signal_t *puVar2;
  uv_signal_s *in_RDI;
  int unaff_retaddr;
  sigset_t saved_sigmask;
  uv_signal_t *removed_handle;
  uv_signal_s *in_stack_ffffffffffffff88;
  uv__signal_tree_s *in_stack_ffffffffffffff90;
  sigset_t *in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  if (in_RDI->signum != 0) {
    uv__signal_block_and_lock(in_stack_ffffffffffffffe0);
    puVar1 = uv__signal_tree_s_RB_REMOVE(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (puVar1 != in_RDI) {
      __assert_fail("removed_handle == handle","src/unix/signal.c",0x1c4,
                    "void uv__signal_stop(uv_signal_t *)");
    }
    puVar2 = uv__signal_first_handle(in_stack_ffffffffffffffec);
    if (puVar2 == (uv_signal_t *)0x0) {
      uv__signal_unregister_handler(unaff_retaddr);
    }
    uv__signal_unlock_and_unblock((sigset_t *)0x113e9b);
    in_RDI->signum = 0;
    if (((in_RDI->flags & 0x4000U) != 0) &&
       (in_RDI->flags = in_RDI->flags & 0xffffbfff, (in_RDI->flags & 0x2000U) != 0)) {
      in_RDI->loop->active_handles = in_RDI->loop->active_handles - 1;
    }
  }
  return;
}

Assistant:

static void uv__signal_stop(uv_signal_t* handle) {
  uv_signal_t* removed_handle;
  sigset_t saved_sigmask;

  /* If the watcher wasn't started, this is a no-op. */
  if (handle->signum == 0)
    return;

  uv__signal_block_and_lock(&saved_sigmask);

  removed_handle = RB_REMOVE(uv__signal_tree_s, &uv__signal_tree, handle);
  assert(removed_handle == handle);
  (void) removed_handle;

  /* Check if there are other active signal watchers observing this signal. If
   * not, unregister the signal handler.
   */
  if (uv__signal_first_handle(handle->signum) == NULL)
    uv__signal_unregister_handler(handle->signum);

  uv__signal_unlock_and_unblock(&saved_sigmask);

  handle->signum = 0;
  uv__handle_stop(handle);
}